

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

RotationType anon_unknown.dwarf_c6aa53::qRotationType(QTransform *transform)

{
  bool bVar1;
  TransformationType TVar2;
  QTransform *in_RDI;
  TransformationType type;
  double in_stack_00000010;
  double in_stack_00000018;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  TVar2 = QTransform::type((QTransform *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if ((int)TVar2 < 5) {
    if (TVar2 == TxRotate) {
      QTransform::m11(in_RDI);
      bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
      if (bVar1) {
        QTransform::m12(in_RDI);
        bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
        if (bVar1) {
          QTransform::m21(in_RDI);
          bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
          if (bVar1) {
            QTransform::m22(in_RDI);
            bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
            if (bVar1) {
              return Rotation90;
            }
          }
        }
      }
    }
    if (TVar2 == TxScale) {
      QTransform::m11(in_RDI);
      bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
      if (bVar1) {
        QTransform::m12(in_RDI);
        bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
        if (bVar1) {
          QTransform::m21(in_RDI);
          bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
          if (bVar1) {
            QTransform::m22(in_RDI);
            bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
            if (bVar1) {
              return Rotation180;
            }
          }
        }
      }
    }
    if (TVar2 == TxRotate) {
      QTransform::m11(in_RDI);
      bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
      if (bVar1) {
        QTransform::m12(in_RDI);
        bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
        if (bVar1) {
          QTransform::m21(in_RDI);
          bVar1 = qFuzzyCompare(in_stack_00000018,in_stack_00000010);
          if (bVar1) {
            QTransform::m22(in_RDI);
            bVar1 = qFuzzyIsNull((double)CONCAT44(TVar2,in_stack_ffffffffffffffe8));
            if (bVar1) {
              return Rotation270;
            }
          }
        }
      }
    }
  }
  return NoRotation;
}

Assistant:

inline RotationType qRotationType(const QTransform &transform)
    {
        QTransform::TransformationType type = transform.type();

        if (type > QTransform::TxRotate)
            return NoRotation;

        if (type == QTransform::TxRotate && qFuzzyIsNull(transform.m11()) && qFuzzyCompare(transform.m12(), qreal(-1))
            && qFuzzyCompare(transform.m21(), qreal(1)) && qFuzzyIsNull(transform.m22()))
            return Rotation90;

        if (type == QTransform::TxScale && qFuzzyCompare(transform.m11(), qreal(-1)) && qFuzzyIsNull(transform.m12())
            && qFuzzyIsNull(transform.m21()) && qFuzzyCompare(transform.m22(), qreal(-1)))
            return Rotation180;

        if (type == QTransform::TxRotate && qFuzzyIsNull(transform.m11()) && qFuzzyCompare(transform.m12(), qreal(1))
            && qFuzzyCompare(transform.m21(), qreal(-1)) && qFuzzyIsNull(transform.m22()))
            return Rotation270;

        return NoRotation;
    }